

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx2::forward
          (Yolov3DetectionOutput_x86_avx2 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  size_t sVar2;
  iterator __position;
  Mat *this_01;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined8 uVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined8 uVar17;
  undefined4 *puVar18;
  float *pfVar19;
  _func_int **pp_Var20;
  undefined4 uVar21;
  BBoxRect *__args;
  _func_int *p_Var22;
  _func_int *p_Var23;
  pointer pvVar24;
  uint uVar25;
  pointer pMVar26;
  long lVar27;
  long in_R10;
  uint uVar28;
  ulong uVar29;
  float *pfVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar41 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1c8;
  ulong local_1a8;
  long local_1a0;
  BBoxRect local_198;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_178;
  undefined1 local_158 [16];
  long local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  Option *local_110;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_108;
  pointer local_100;
  long local_f8;
  long local_f0;
  void *local_e8;
  long local_e0;
  Yolov3DetectionOutput_x86_avx2 *local_d8;
  long local_d0;
  undefined8 local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  undefined1 auVar42 [16];
  
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = top_blobs;
  local_110 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_1a8 = 0;
    local_108 = bottom_blobs;
    local_d8 = this;
    do {
      pvVar12 = local_108;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1c8,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
      pMVar26 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx2;
      p_Var22 = pp_Var20[-3];
      iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var22);
      iVar13 = pMVar26[local_1a8].c / iVar14;
      if (iVar13 != *(int *)(&this->field_0xd0 + (long)p_Var22) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1c8);
        iVar14 = -1;
        goto LAB_002b95be;
      }
      if (0 < iVar14) {
        pMVar26 = pMVar26 + local_1a8;
        uVar29._0_4_ = pMVar26->w;
        uVar29._4_4_ = pMVar26->h;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar29;
        p_Var23 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 + (long)p_Var22);
        auVar4 = vcvtdq2ps_avx(auVar33);
        fVar31 = *(float *)(*(long *)(p_Var23 + 0x170) + local_1a8 * 4);
        uVar21 = vextractps_avx(auVar33,1);
        local_140 = CONCAT44((int)((ulong)*(long *)(p_Var23 + 0x170) >> 0x20),uVar21);
        auVar47._0_4_ = fVar31 * auVar4._0_4_;
        auVar47._4_4_ = fVar31 * auVar4._4_4_;
        auVar47._8_4_ = fVar31 * auVar4._8_4_;
        auVar47._12_4_ = fVar31 * auVar4._12_4_;
        in_R10 = CONCAT44((int)((ulong)in_R10 >> 0x20),(undefined4)uVar29);
        local_b8 = vroundps_avx(auVar47,0xb);
        local_f0 = (long)iVar13;
        auVar34._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar34._12_4_ = 0x3f000000;
        register0x00001288 = auVar34._8_8_;
        local_98 = auVar4._0_8_;
        auVar4 = vrcpps_avx(_local_98);
        auVar41._8_4_ = 0x3f800000;
        auVar41._0_8_ = 0x3f8000003f800000;
        auVar41._12_4_ = 0x3f800000;
        auVar33 = vfmsub213ps_fma(auVar4,_local_98,auVar41);
        _local_a8 = vfnmadd132ps_fma(auVar33,auVar4,auVar4);
        lVar27 = (long)iVar14 * local_1a8 * 4;
        local_1a0 = 0;
        local_100 = pMVar26;
        local_f8 = lVar27;
        local_d0 = in_R10;
        do {
          if (pMVar26->dims == 3) {
            lVar16 = (long)pMVar26->h * (long)pMVar26->w;
          }
          else {
            lVar16 = (long)pMVar26->h * (long)pMVar26->w * (long)pMVar26->d;
          }
          uVar29 = pMVar26->elemsize;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar29;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = lVar16 * uVar29 + 0xf & 0xfffffffffffffff0;
          uVar17 = SUB168(auVar3 / auVar4,0);
          if (0 < (int)local_140) {
            lVar16 = local_1a0 * local_f0;
            auVar35._8_8_ = 0;
            auVar35._0_8_ =
                 *(ulong *)(*(long *)(p_Var23 + 0xe0) +
                           (long)((int)*(float *)(*(long *)(p_Var23 + 0x128) + lVar27 +
                                                 local_1a0 * 4) * 2) * 4);
            local_e8 = pMVar26->data;
            sVar2 = pMVar26->cstep;
            local_120 = (float *)(sVar2 * lVar16 * uVar29 + (long)local_e8);
            local_128 = (float *)((lVar16 + 1) * sVar2 * uVar29 + (long)local_e8);
            local_130 = (float *)((lVar16 + 2) * sVar2 * uVar29 + (long)local_e8);
            local_138 = (float *)((lVar16 + 3) * sVar2 * uVar29 + (long)local_e8);
            pfVar30 = (float *)((lVar16 + 4) * sVar2 * uVar29 + (long)local_e8);
            local_e8 = (void *)((lVar16 + 5) * sVar2 * uVar29 + (long)local_e8);
            uVar28 = SUB164(auVar3 / auVar4,0);
            auVar4 = vpinsrd_avx(ZEXT416(uVar28 * 4),uVar28 * 5,1);
            auVar4 = vpinsrd_avx(auVar4,uVar28 * 6,2);
            auVar4 = vpinsrd_avx(auVar4,uVar28 * 7,3);
            auVar33 = vpunpckldq_avx(ZEXT416(uVar28 * 2),ZEXT416(uVar28 * 3));
            auVar33 = vshufps_avx(ZEXT416(uVar28),auVar33,0x41);
            local_58._16_16_ = auVar4;
            local_58._0_16_ = auVar33;
            auVar42._8_4_ = 0x3f800000;
            auVar42._0_8_ = 0x3f8000003f800000;
            auVar42._12_4_ = 0x3f800000;
            auVar46 = ZEXT1664(auVar42);
            local_88 = vmovlhps_avx(auVar42,auVar35);
            lVar27 = 0;
            local_c8 = uVar17;
            do {
              local_e0 = lVar27;
              if (0 < (int)in_R10) {
                auVar36._0_4_ = (float)(int)lVar27;
                local_c0 = (void *)((long)local_e8 + lVar27 * in_R10 * 4);
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                local_78 = vunpcklpd_avx(auVar36,local_b8);
                lVar27 = 0;
                do {
                  pfVar1 = (float *)((long)local_c0 + lVar27 * 4);
                  p_Var22 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
                  iVar14 = (*(uint *)(&this->field_0xd0 + (long)p_Var22) & 0xfffffff8) * (int)uVar17
                  ;
                  pfVar19 = pfVar1;
                  if (iVar14 < 1) {
                    iVar15 = 0;
                    auVar52 = ZEXT464(0xff7fffff);
                    iVar13 = 0;
                  }
                  else {
                    iVar13 = 0;
                    auVar52 = ZEXT464(0xff7fffff);
                    iVar15 = 0;
                    do {
                      auVar6 = vpcmpeqd_avx2(auVar46._0_32_,auVar46._0_32_);
                      auVar40 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar6);
                      auVar6 = vpermpd_avx2(auVar40,0x4e);
                      auVar6 = vmaxps_avx(auVar40,auVar6);
                      auVar5 = vshufpd_avx(auVar6,auVar6,5);
                      auVar6 = vmaxps_avx(auVar6,auVar5);
                      auVar5 = vshufps_avx(auVar6,auVar6,0xb1);
                      auVar6 = vmaxps_avx(auVar6,auVar5);
                      auVar46 = ZEXT3264(auVar6);
                      if (auVar52._0_4_ < auVar6._0_4_) {
                        auVar5 = vcmpps_avx(auVar40,auVar6,0);
                        uVar25 = vmovmskps_avx(auVar5);
                        iVar13 = 0;
                        if (uVar25 != 0) {
                          for (; (uVar25 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
                          }
                        }
                        iVar13 = iVar13 + iVar15;
                        auVar52 = ZEXT1664(auVar6._0_16_);
                      }
                      pfVar19 = pfVar19 + (int)(uVar28 * 8);
                      iVar15 = iVar15 + 8;
                    } while (pfVar19 < pfVar1 + iVar14);
                  }
                  for (; local_158 = auVar52._0_16_,
                      pfVar19 < pfVar1 + (int)(*(uint *)(&this->field_0xd0 + (long)p_Var22) *
                                              (int)uVar17); pfVar19 = pfVar19 + (int)uVar28) {
                    if (auVar52._0_4_ < *pfVar19) {
                      iVar13 = iVar15;
                    }
                    auVar4 = vmaxss_avx(ZEXT416((uint)*pfVar19),local_158);
                    auVar52 = ZEXT1664(auVar4);
                    iVar15 = iVar15 + 1;
                  }
                  fVar31 = expf(-*pfVar30);
                  fVar32 = expf(-(float)local_158._0_4_);
                  this = local_d8;
                  auVar46 = ZEXT464(0x3f800000);
                  auVar4 = vfmadd132ss_fma(ZEXT416((uint)(fVar32 + 1.0)),auVar46._0_16_,
                                           ZEXT416((uint)fVar31));
                  fVar31 = 1.0 / auVar4._0_4_;
                  if (*(float *)(&local_d8->field_0xd8 + (long)p_Var22) <= fVar31) {
                    fVar32 = expf(-*local_120);
                    local_158 = ZEXT416((uint)(fVar32 + 1.0));
                    fVar32 = expf(-*local_128);
                    local_68 = vinsertps_avx(local_158,ZEXT416((uint)(fVar32 + 1.0)),0x10);
                    local_158._0_4_ = expf(*local_130);
                    local_158._4_4_ = extraout_XMM0_Db;
                    local_158._8_4_ = extraout_XMM0_Dc;
                    local_158._12_4_ = extraout_XMM0_Dd;
                    auVar46._0_4_ = expf(*local_138);
                    auVar46._4_60_ = extraout_var;
                    auVar4 = vrcpps_avx(local_68);
                    auVar48._0_4_ = local_88._0_4_ * auVar4._0_4_;
                    auVar48._4_4_ = local_88._4_4_ * auVar4._4_4_;
                    auVar48._8_4_ = local_88._8_4_ * auVar4._8_4_;
                    auVar48._12_4_ = local_88._12_4_ * auVar4._12_4_;
                    auVar33 = vfmsub213ps_fma(local_68,auVar48,local_88);
                    auVar34 = vfnmadd213ps_fma(auVar33,auVar4,auVar48);
                    auVar43._8_8_ = local_158._0_8_;
                    auVar43._0_8_ = local_158._0_8_;
                    auVar4 = vinsertps_avx(auVar43,auVar46._0_16_,0x30);
                    auVar7._4_8_ = auVar4._8_8_;
                    auVar7._0_4_ = local_88._4_4_ * auVar4._4_4_;
                    auVar37._0_8_ = auVar7._0_8_ << 0x20;
                    auVar37._8_4_ = local_88._8_4_ * auVar4._8_4_;
                    auVar37._12_4_ = local_88._12_4_ * auVar4._12_4_;
                    auVar38._8_8_ = auVar37._8_8_;
                    auVar38._0_8_ = auVar34._0_8_;
                    auVar44._0_4_ = (float)(int)lVar27;
                    auVar44._4_12_ = local_78._4_12_;
                    auVar4 = vrcpps_avx(auVar44);
                    auVar51._0_4_ = auVar34._0_4_ * auVar4._0_4_;
                    auVar51._4_4_ = auVar34._4_4_ * auVar4._4_4_;
                    auVar51._8_4_ = auVar37._8_4_ * auVar4._8_4_;
                    auVar51._12_4_ = auVar37._12_4_ * auVar4._12_4_;
                    auVar33 = vfmsub231ps_fma(auVar38,auVar44,auVar51);
                    auVar41 = vfnmadd213ps_fma(auVar33,auVar4,auVar51);
                    auVar45._0_4_ = (auVar34._0_4_ + auVar44._0_4_) * (float)local_a8._0_4_;
                    auVar45._4_4_ = (auVar34._4_4_ + local_78._4_4_) * (float)local_a8._4_4_;
                    auVar45._8_4_ = (auVar34._8_4_ + local_78._8_4_) * fStack_a0;
                    auVar45._12_4_ = (auVar34._12_4_ + local_78._12_4_) * fStack_9c;
                    auVar49._0_4_ = auVar41._0_4_ * (float)local_98._0_4_;
                    auVar49._4_4_ = auVar41._4_4_ * (float)local_98._4_4_;
                    auVar49._8_4_ = auVar41._8_4_ * fStack_90;
                    auVar49._12_4_ = auVar41._12_4_ * fStack_8c;
                    auVar4 = vshufpd_avx(auVar49,auVar45,1);
                    auVar33 = vsubps_avx(auVar45,auVar4);
                    auVar8._4_8_ = auVar49._8_8_;
                    auVar8._0_4_ = auVar49._4_4_ + auVar4._4_4_;
                    auVar50._0_8_ = auVar8._0_8_ << 0x20;
                    auVar50._8_4_ = auVar49._8_4_ + auVar4._8_4_;
                    auVar50._12_4_ = auVar49._12_4_ + auVar4._12_4_;
                    uVar17 = auVar50._8_8_;
                    auVar46 = ZEXT1664(CONCAT88(uVar17,auVar33._0_8_));
                    auVar4 = vmovshdup_avx(auVar41);
                    auVar39._0_4_ = auVar4._0_4_ * auVar41._0_4_;
                    auVar39._4_4_ = auVar4._4_4_ * auVar41._4_4_;
                    auVar39._8_4_ = auVar4._8_4_ * auVar41._8_4_;
                    auVar39._12_4_ = auVar4._12_4_ * auVar41._12_4_;
                    local_198.xmin = auVar33._0_4_;
                    local_198.ymin = auVar33._4_4_;
                    local_198.area = (float)vextractps_avx(auVar39,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1a0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_198.score = fVar31;
                    local_198.xmax = auVar50._8_4_;
                    local_198.ymax = auVar50._12_4_;
                    local_198.label = iVar13;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_198);
                    }
                    else {
                      auVar11._8_4_ = local_198.area;
                      auVar11._0_8_ = uVar17;
                      auVar11._12_4_ = iVar13;
                      auVar46 = ZEXT1664(auVar11);
                      (__position._M_current)->xmax = (float)(int)uVar17;
                      (__position._M_current)->ymax = (float)(int)((ulong)uVar17 >> 0x20);
                      (__position._M_current)->area = local_198.area;
                      (__position._M_current)->label = iVar13;
                      (__position._M_current)->score = fVar31;
                      (__position._M_current)->xmin = local_198.xmin;
                      (__position._M_current)->ymin = local_198.ymin;
                      (__position._M_current)->xmax = auVar50._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  local_120 = local_120 + 1;
                  local_128 = local_128 + 1;
                  local_130 = local_130 + 1;
                  local_138 = local_138 + 1;
                  pfVar30 = pfVar30 + 1;
                  lVar27 = lVar27 + 1;
                  in_R10 = local_d0;
                  uVar17 = local_c8;
                } while (lVar27 != local_d0);
              }
              lVar27 = local_e0 + 1;
            } while (lVar27 != local_140);
            pp_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx2;
            pMVar26 = local_100;
            lVar27 = local_f8;
          }
          local_1a0 = local_1a0 + 1;
          p_Var22 = pp_Var20[-3];
          p_Var23 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 + (long)p_Var22)
          ;
        } while (local_1a0 < *(int *)(&this->field_0xd4 + (long)p_Var22));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var22)) {
        lVar27 = 8;
        lVar16 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_178,
                     local_178.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar27 + -8),
                     *(undefined8 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar27));
          lVar16 = lVar16 + 1;
          lVar27 = lVar27 + 0x18;
        } while (lVar16 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      local_1a8 = local_1a8 + 1;
    } while (local_1a8 <
             (ulong)(((long)(local_108->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_108->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&local_178);
  local_198.score = 0.0;
  local_198.xmin = 0.0;
  local_198.ymin = 0.0;
  local_198.xmax = 0.0;
  local_198.ymax = 0.0;
  local_198.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&local_178,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar27 = CONCAT44(local_198.xmin,local_198.score);
  lVar16 = CONCAT44(local_198.xmax,local_198.ymin);
  if (lVar16 == lVar27) {
    pvVar24 = (pointer)0x0;
    iVar14 = 0;
  }
  else {
    uVar29 = 0;
    do {
      __args = local_178.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar27 + uVar29 * 8);
      if (local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1c8,
                   (iterator)
                   local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar27 = CONCAT44(local_198.xmin,local_198.score);
        lVar16 = CONCAT44(local_198.xmax,local_198.ymin);
      }
      else {
        uVar17 = *(undefined8 *)__args;
        uVar9 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1c8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar17;
        *(undefined8 *)
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar9;
        local_1c8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < (ulong)(lVar16 - lVar27 >> 3));
    uVar28 = (int)((long)local_1c8.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c8.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar14 = 0;
    if (uVar28 != 0) {
      this_01 = (local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,uVar28,4,local_110->blob_allocator);
      iVar14 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar14 = 0, 0 < (int)uVar28)) {
        iVar13 = this_01->w;
        sVar2 = this_01->elemsize;
        puVar18 = (undefined4 *)((long)this_01->data + 0x14);
        iVar14 = 0;
        lVar27 = 0;
        do {
          uVar21 = *(undefined4 *)
                    ((long)&((local_1c8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar27);
          puVar18[-5] = (float)(*(int *)((long)&local_1c8.
                                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[1].
                                                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar27)
                               + 1);
          puVar18[-4] = uVar21;
          puVar18[-3] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar27 + 4);
          puVar18[-2] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar27);
          puVar18[-1] = *(undefined4 *)
                         ((long)&((local_1c8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar27 + 4);
          *puVar18 = *(undefined4 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar27);
          lVar27 = lVar27 + 0x1c;
          puVar18 = (undefined4 *)((long)puVar18 + (long)iVar13 * sVar2);
        } while ((ulong)(uVar28 & 0x7fffffff) * 0x1c != lVar27);
      }
    }
    pvVar24 = local_1c8.
              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pvVar24 != (pointer)0x0) {
    operator_delete(pvVar24,(long)local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar24
                   );
  }
  pvVar10 = (void *)CONCAT44(local_198.xmin,local_198.score);
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,CONCAT44(local_198.area,local_198.ymax) - (long)pvVar10);
  }
LAB_002b95be:
  if (local_178.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar14;
}

Assistant:

int Yolov3DetectionOutput_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}